

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O1

char * owner_parse(char *spec,int *uid,int *gid)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  char *__name;
  passwd *ppVar4;
  group *pgVar5;
  int *piVar6;
  ulong uVar7;
  size_t __n;
  byte *pbVar8;
  byte *__name_00;
  char *pcVar9;
  char *end;
  char *local_40;
  __gid_t *local_38;
  
  *uid = -1;
  *gid = -1;
  cVar1 = *spec;
  if (cVar1 == '\0') {
    return "Invalid empty user/group spec";
  }
  if ((cVar1 == '.') || (pbVar8 = (byte *)spec, cVar1 == ':')) {
    __name_00 = (byte *)(spec + 1);
    pbVar8 = (byte *)0x0;
    spec = (char *)0x0;
  }
  else {
    while( true ) {
      bVar2 = *pbVar8;
      if (((ulong)bVar2 < 0x3b) && ((0x400400000000001U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) break;
      pbVar8 = pbVar8 + 1;
    }
    __name_00 = pbVar8 + (bVar2 != 0);
  }
  pcVar9 = (char *)uid;
  if (spec != (char *)0x0) {
    __n = (long)pbVar8 - (long)spec;
    local_38 = (__gid_t *)gid;
    __name = (char *)malloc(__n + 1);
    if (__name == (char *)0x0) {
      pcVar9 = "Couldn\'t allocate memory";
      bVar3 = false;
    }
    else {
      memcpy(__name,spec,__n);
      __name[__n] = '\0';
      ppVar4 = getpwnam(__name);
      if (ppVar4 == (passwd *)0x0) {
        piVar6 = __errno_location();
        *piVar6 = 0;
        uVar7 = strtoul(__name,&local_40,10);
        *uid = (int)uVar7;
        if ((*piVar6 != 0) || (*local_40 != '\0')) {
          pcVar9 = owner_parse::errbuff;
          bVar3 = false;
          snprintf(owner_parse::errbuff,0x80,"Couldn\'t lookup user ``%s\'\'",__name);
          owner_parse::errbuff[0x7f] = '\0';
          free(__name);
          goto LAB_0010e2a5;
        }
      }
      else {
        *uid = ppVar4->pw_uid;
        if (*pbVar8 != 0) {
          *local_38 = ppVar4->pw_gid;
        }
      }
      free(__name);
      pcVar9 = owner_parse::errbuff;
      bVar3 = true;
    }
LAB_0010e2a5:
    gid = (int *)local_38;
    if (!bVar3) {
      return (char *)(int *)pcVar9;
    }
  }
  if (*__name_00 == 0) {
    return (char *)0x0;
  }
  pgVar5 = getgrnam((char *)__name_00);
  if (pgVar5 == (group *)0x0) {
    piVar6 = __errno_location();
    *piVar6 = 0;
    uVar7 = strtoul((char *)__name_00,&local_40,10);
    *gid = (__gid_t)uVar7;
    if ((*piVar6 != 0) || (*local_40 != '\0')) {
      pcVar9 = owner_parse::errbuff;
      bVar3 = false;
      snprintf(owner_parse::errbuff,0x80,"Couldn\'t lookup group ``%s\'\'",__name_00);
      owner_parse::errbuff[0x7f] = '\0';
      goto LAB_0010e326;
    }
  }
  else {
    *gid = pgVar5->gr_gid;
  }
  bVar3 = true;
LAB_0010e326:
  if (bVar3) {
    return (char *)0x0;
  }
  return (char *)(int *)pcVar9;
}

Assistant:

const char *
owner_parse(const char *spec, int *uid, int *gid)
{
	static char errbuff[128];
	const char *u, *ue, *g;

	*uid = -1;
	*gid = -1;

	if (spec[0] == '\0')
		return ("Invalid empty user/group spec");

	/*
	 * Split spec into [user][:.][group]
	 *  u -> first char of username, NULL if no username
	 *  ue -> first char after username (colon, period, or \0)
	 *  g -> first char of group name
	 */
	if (*spec == ':' || *spec == '.') {
		/* If spec starts with ':' or '.', then just group. */
		ue = u = NULL;
		g = spec + 1;
	} else {
		/* Otherwise, [user] or [user][:] or [user][:][group] */
		ue = u = spec;
		while (*ue != ':' && *ue != '.' && *ue != '\0')
			++ue;
		g = ue;
		if (*g != '\0') /* Skip : or . to find first char of group. */
			++g;
	}

	if (u != NULL) {
		/* Look up user: ue is first char after end of user. */
		char *user;
		struct passwd *pwent;

		user = (char *)malloc(ue - u + 1);
		if (user == NULL)
			return ("Couldn't allocate memory");
		memcpy(user, u, ue - u);
		user[ue - u] = '\0';
		if ((pwent = getpwnam(user)) != NULL) {
			*uid = pwent->pw_uid;
			if (*ue != '\0')
				*gid = pwent->pw_gid;
		} else {
			char *end;
			errno = 0;
			*uid = (int)strtoul(user, &end, 10);
			if (errno || *end != '\0') {
				snprintf(errbuff, sizeof(errbuff),
				    "Couldn't lookup user ``%s''", user);
				errbuff[sizeof(errbuff) - 1] = '\0';
				free(user);
				return (errbuff);
			}
		}
		free(user);
	}

	if (*g != '\0') {
		struct group *grp;
		if ((grp = getgrnam(g)) != NULL) {
			*gid = grp->gr_gid;
		} else {
			char *end;
			errno = 0;
			*gid = (int)strtoul(g, &end, 10);
			if (errno || *end != '\0') {
				snprintf(errbuff, sizeof(errbuff),
				    "Couldn't lookup group ``%s''", g);
				errbuff[sizeof(errbuff) - 1] = '\0';
				return (errbuff);
			}
		}
	}
	return (NULL);
}